

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

wchar_t slot_by_type(player *p,wchar_t type,_Bool full)

{
  ushort uVar1;
  wchar_t wVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  object **ppoVar7;
  
  uVar1 = (p->body).count;
  uVar4 = (ulong)uVar1;
  if (uVar1 == 0) {
    wVar2 = L'\0';
    uVar6 = 0;
  }
  else {
    ppoVar7 = &((p->body).slots)->obj;
    uVar5 = 0;
    uVar3 = uVar4;
    do {
      wVar2 = (wchar_t)uVar3;
      if ((uint)*(ushort *)(ppoVar7 + -2) == type) {
        uVar6 = uVar5;
        if (*ppoVar7 == (object *)0x0) break;
        if (wVar2 == (uint)uVar1) {
          uVar3 = uVar5 & 0xffffffff;
        }
      }
      wVar2 = (wchar_t)uVar3;
      uVar5 = uVar5 + 1;
      ppoVar7 = ppoVar7 + 4;
      uVar6 = uVar4;
    } while (uVar4 != uVar5);
  }
  if ((wchar_t)uVar6 != (uint)uVar1) {
    wVar2 = (wchar_t)uVar6;
  }
  return wVar2;
}

Assistant:

static int slot_by_type(struct player *p, int type, bool full)
{
	int i, fallback = p->body.count;

	/* Look for a correct slot type */
	for (i = 0; i < p->body.count; i++) {
		if (type == p->body.slots[i].type) {
			if (full) {
				/* Found a full slot */
				if (p->body.slots[i].obj != NULL) break;
			} else {
				/* Found an empty slot */
				if (p->body.slots[i].obj == NULL) break;
			}
			/* Not right for full/empty, but still the right type */
			if (fallback == p->body.count)
				fallback = i;
		}
	}

	/* Index for the best slot we found, or p->body.count if none found  */
	return (i != p->body.count) ? i : fallback;
}